

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::GenerateLoadPolymorphicInlineCacheSlot
               (Instr *instrLdSt,RegOpnd *opndInlineCache,RegOpnd *opndType,
               uint polymorphicInlineCacheSize)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  RegOpnd *indexOpnd;
  Instr *pIVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  IndirOpnd *src1Opnd;
  IndirOpnd *indirOpnd;
  IntConstType leftShiftAmount;
  IntConstType rightShiftAmount;
  Instr *instr;
  RegOpnd *opndOffset;
  uint polymorphicInlineCacheSize_local;
  RegOpnd *opndType_local;
  RegOpnd *opndInlineCache_local;
  Instr *instrLdSt_local;
  
  indexOpnd = IR::RegOpnd::New(TyUint64,instrLdSt->m_func);
  pIVar4 = IR::Instr::New(MOV,&indexOpnd->super_Opnd,&opndType->super_Opnd,instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar4);
  uVar3 = Math::Log2(0x20);
  if (5 < (ulong)uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xfc2,"(rightShiftAmount > leftShiftAmount)",
                       "rightShiftAmount > leftShiftAmount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar6 = IR::IntConstOpnd::New(6 - (ulong)uVar3,TyUint8,instrLdSt->m_func,true);
  pIVar4 = IR::Instr::New(SHR,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar6->super_Opnd,
                          instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar4);
  pIVar6 = IR::IntConstOpnd::New
                     ((ulong)(polymorphicInlineCacheSize - 1) << ((byte)uVar3 & 0x3f),TyInt64,
                      instrLdSt->m_func,true);
  pIVar4 = IR::Instr::New(AND,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar6->super_Opnd,
                          instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar4);
  src1Opnd = IR::IndirOpnd::New(opndInlineCache,indexOpnd,TyUint64,instrLdSt->m_func);
  pIVar4 = IR::Instr::New(LEA,&opndInlineCache->super_Opnd,&src1Opnd->super_Opnd,instrLdSt->m_func);
  IR::Instr::InsertBefore(instrLdSt,pIVar4);
  return;
}

Assistant:

void
LowererMD::GenerateLoadPolymorphicInlineCacheSlot(IR::Instr * instrLdSt, IR::RegOpnd * opndInlineCache, IR::RegOpnd * opndType, uint polymorphicInlineCacheSize)
{
    // Generate
    //
    // MOV r1, type
    // SHR r1, PolymorphicInlineCacheShift
    // AND r1, (size - 1)
    // SHL r1, log2(sizeof(Js::InlineCache))
    // LEA inlineCache, [inlineCache + r1]

    // MOV r1, type
    IR::RegOpnd * opndOffset = IR::RegOpnd::New(TyMachPtr, instrLdSt->m_func);
    IR::Instr * instr = IR::Instr::New(Js::OpCode::MOV, opndOffset, opndType, instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);

    IntConstType rightShiftAmount = PolymorphicInlineCacheShift;
    IntConstType leftShiftAmount = Math::Log2(sizeof(Js::InlineCache));
    // instead of generating
    // SHR r1, PolymorphicInlineCacheShift
    // AND r1, (size - 1)
    // SHL r1, log2(sizeof(Js::InlineCache))
    //
    // we can generate:
    // SHR r1, (PolymorphicInlineCacheShift - log2(sizeof(Js::InlineCache))
    // AND r1, (size - 1) << log2(sizeof(Js::InlineCache))
    Assert(rightShiftAmount > leftShiftAmount);
    instr = IR::Instr::New(Js::OpCode::SHR, opndOffset, opndOffset, IR::IntConstOpnd::New(rightShiftAmount - leftShiftAmount, TyUint8, instrLdSt->m_func, true), instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);
    instr = IR::Instr::New(Js::OpCode::AND, opndOffset, opndOffset, IR::IntConstOpnd::New(((__int64)(polymorphicInlineCacheSize - 1) << leftShiftAmount), TyMachReg, instrLdSt->m_func, true), instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);

    // LEA inlineCache, [inlineCache + r1]
    IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(opndInlineCache, opndOffset, TyMachPtr, instrLdSt->m_func);
    instr = IR::Instr::New(Js::OpCode::LEA, opndInlineCache, indirOpnd, instrLdSt->m_func);
    instrLdSt->InsertBefore(instr);
}